

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODITFReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::ITFReader::decodePattern
          (ITFReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  uint3 uVar1;
  bool bVar2;
  char cVar3;
  unsigned_short uVar4;
  value_type vVar5;
  value_type vVar6;
  uint uVar7;
  int xStart_00;
  int *piVar8;
  PatternView *in_RCX;
  long in_RSI;
  Barcode *in_RDI;
  int xStop;
  SymbologyIdentifier symbologyIdentifier;
  Error error;
  int i_1;
  int i;
  BarAndSpace<int> numWide;
  BarAndSpace<int> digits;
  BarAndSpaceI threshold;
  int xStart;
  int weights [5];
  string txt;
  int minQuietZone;
  int minCharCount;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  Error *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined5 in_stack_fffffffffffffda0;
  Type in_stack_fffffffffffffda5;
  short in_stack_fffffffffffffda6;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  double in_stack_fffffffffffffdb8;
  byte *pbVar9;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  PatternView *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffe00;
  undefined1 readerInit;
  BarcodeFormat in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  int xStop_00;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  SymbologyIdentifier in_stack_fffffffffffffe30;
  value_type in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3a;
  undefined1 in_stack_fffffffffffffe3b;
  BarAndSpaceI in_stack_fffffffffffffe3c;
  undefined4 local_15d;
  byte local_159;
  string local_158 [32];
  undefined1 local_138 [52];
  undefined4 local_104;
  Iterator local_100;
  undefined8 uStack_f8;
  Iterator local_f0;
  Iterator puStack_e8;
  int local_dc;
  int local_d8;
  BarAndSpace<int> local_d4;
  BarAndSpace<int> local_cc;
  BarAndSpaceI local_c4;
  Iterator local_c0;
  undefined8 local_b8;
  Iterator local_b0;
  Iterator local_a8;
  int local_9c;
  int local_98 [10];
  string local_70 [32];
  Iterator local_50;
  undefined8 local_48;
  Iterator local_40;
  Iterator local_38;
  undefined4 local_30;
  undefined4 local_2c;
  PatternView *local_20;
  
  local_2c = 6;
  local_30 = 10;
  local_20 = in_RCX;
  FindLeftGuard<4,4,false>
            ((PatternView *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (FixedPattern<4,_4,_false> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  local_20->_data = local_50;
  *(undefined8 *)&local_20->_size = local_48;
  local_20->_base = local_40;
  local_20->_end = local_38;
  bVar2 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd90);
  if (!bVar2) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    return in_RDI;
  }
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::reserve((ulong)local_70);
  local_98[0] = 1;
  local_98[1] = 2;
  local_98[2] = 4;
  local_98[3] = 7;
  local_98[4] = 0;
  local_9c = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffd90);
  PatternView::subView
            ((PatternView *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
  local_20->_data = local_c0;
  *(undefined8 *)&local_20->_size = local_b8;
  local_20->_base = local_b0;
  local_20->_end = local_a8;
  while( true ) {
    bVar2 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd90);
    readerInit = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
    if (!bVar2) break;
    in_stack_fffffffffffffe3c = OneD::RowReader::NarrowWideThreshold(in_stack_fffffffffffffdc8);
    local_c4 = in_stack_fffffffffffffe3c;
    in_stack_fffffffffffffe3b = BarAndSpace<unsigned_short>::isValid(&local_c4);
    readerInit = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
    if (!(bool)in_stack_fffffffffffffe3b) break;
    BarAndSpace<int>::BarAndSpace(&local_cc);
    BarAndSpace<int>::BarAndSpace(&local_d4);
    for (local_d8 = 0; local_d8 < 10; local_d8 = local_d8 + 1) {
      in_stack_fffffffffffffe38 = PatternView::operator[](local_20,local_d8);
      uVar7 = (uint)in_stack_fffffffffffffe38;
      uVar4 = BarAndSpace<unsigned_short>::operator[](&local_c4,local_d8);
      if ((uint)uVar4 * 2 < uVar7) break;
      vVar5 = PatternView::operator[](local_20,local_d8);
      in_stack_fffffffffffffe24 = (uint)vVar5;
      uVar4 = BarAndSpace<unsigned_short>::operator[](&local_c4,local_d8);
      bVar2 = (int)(uint)uVar4 < (int)in_stack_fffffffffffffe24;
      piVar8 = BarAndSpace<int>::operator[](&local_d4,local_d8);
      *piVar8 = *piVar8 + (uint)bVar2;
      in_stack_fffffffffffffe20 = local_98[local_d8 / 2];
      vVar6 = PatternView::operator[](local_20,local_d8);
      in_stack_fffffffffffffe30.eciModifierOffset = (char)vVar5;
      in_stack_fffffffffffffe30.aiFlag = (char)(vVar5 >> 8);
      in_stack_fffffffffffffe30.code = (char)vVar6;
      in_stack_fffffffffffffe30.modifier = (char)(vVar6 >> 8);
      in_stack_fffffffffffffe1c = (uint)vVar6;
      uVar4 = BarAndSpace<unsigned_short>::operator[](&local_c4,local_d8);
      in_stack_fffffffffffffe20 =
           in_stack_fffffffffffffe20 * (uint)((int)(uint)uVar4 < (int)in_stack_fffffffffffffe1c);
      piVar8 = BarAndSpace<int>::operator[](&local_cc,local_d8);
      *piVar8 = in_stack_fffffffffffffe20 + *piVar8;
    }
    readerInit = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
    if ((local_d4.bar != 2) || (local_d4.space != 2)) break;
    for (local_dc = 0; local_dc < 2; local_dc = local_dc + 1) {
      piVar8 = BarAndSpace<int>::operator[](&local_cc,local_dc);
      if (*piVar8 == 0xb) {
        in_stack_fffffffffffffe18 = 0;
      }
      else {
        piVar8 = BarAndSpace<int>::operator[](&local_cc,local_dc);
        in_stack_fffffffffffffe18 = *piVar8;
      }
      cVar3 = ToDigit<char>(in_stack_fffffffffffffdd4);
      in_stack_fffffffffffffe14 = CONCAT13(cVar3,(int3)in_stack_fffffffffffffe14);
      std::__cxx11::string::push_back((char)local_70);
    }
    PatternView::skipSymbol((PatternView *)0x29e89b);
  }
  PatternView::subView
            ((PatternView *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
  local_20->_base = local_f0;
  local_20->_end = puStack_e8;
  local_20->_data = local_100;
  *(undefined8 *)&local_20->_size = uStack_f8;
  xStart_00 = Size<std::__cxx11::string>(&in_stack_fffffffffffffd90->_msg);
  if (5 < xStart_00) {
    bVar2 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd90);
    xStop_00 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe0c);
    if (bVar2) {
      bVar2 = IsRightGuard<3,4,false>
                        ((PatternView *)
                         CONCAT26(in_stack_fffffffffffffda6,
                                  CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)),
                         (FixedPattern<3,_4,_false> *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (double)in_stack_fffffffffffffd90,
                         (double)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      if ((bVar2) ||
         (bVar2 = IsRightGuard<3,5,false>
                            ((PatternView *)
                             CONCAT26(in_stack_fffffffffffffda6,
                                      CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0))
                             ,(FixedPattern<3,_5,_false> *)
                              CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (double)in_stack_fffffffffffffd90,
                             (double)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)),
         bVar2)) {
        bVar2 = ReaderOptions::validateITFCheckSum(*(ReaderOptions **)(in_RSI + 8));
        local_159 = 0;
        if ((!bVar2) ||
           (bVar2 = GTIN::IsCheckDigitValid<char>(&in_stack_fffffffffffffd90->_msg), bVar2)) {
          memset(local_138,0,0x30);
          Error::Error(in_stack_fffffffffffffd90);
        }
        else {
          std::__cxx11::string::string(local_158);
          local_159 = 1;
          Error::Error((Error *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                       in_stack_fffffffffffffda6,in_stack_fffffffffffffda5,
                       (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        }
        if ((local_159 & 1) != 0) {
          std::__cxx11::string::~string(local_158);
        }
        local_15d = CONCAT31(local_15d._1_3_,0x49);
        pbVar9 = (byte *)((long)&local_15d + 1);
        bVar2 = GTIN::IsCheckDigitValid<char>(&in_stack_fffffffffffffd90->_msg);
        *pbVar9 = bVar2 | 0x30;
        uVar1 = (uint3)local_15d;
        local_15d = (uint)(uVar1 & 0xffff);
        PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffd90);
        Error::Error(in_stack_fffffffffffffd90,
                     (Error *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        Result::Result((Result *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe14,xStart_00,xStop_00,in_stack_fffffffffffffe08,
                       in_stack_fffffffffffffe30,
                       (Error *)CONCAT44(in_stack_fffffffffffffe3c,
                                         CONCAT13(in_stack_fffffffffffffe3b,
                                                  CONCAT12(in_stack_fffffffffffffe3a,
                                                           in_stack_fffffffffffffe38))),
                       (bool)readerInit);
        Error::~Error((Error *)0x29ec28);
        local_104 = 1;
        Error::~Error((Error *)0x29ec40);
      }
      else {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result((Result *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        local_104 = 1;
      }
      goto LAB_0029ecb7;
    }
  }
  in_RDI->_format = None;
  in_RDI->_ecLevel[0] = '\0';
  in_RDI->_ecLevel[1] = '\0';
  in_RDI->_ecLevel[2] = '\0';
  in_RDI->_ecLevel[3] = '\0';
  in_RDI->_version[0] = '\0';
  in_RDI->_version[1] = '\0';
  in_RDI->_version[2] = '\0';
  in_RDI->_version[3] = '\0';
  in_RDI->_lineCount = 0;
  (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
  *(undefined8 *)&(in_RDI->_sai).id = 0;
  (in_RDI->_sai).id._M_string_length = 0;
  *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
  (in_RDI->_sai).index = 0;
  (in_RDI->_sai).count = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  *(undefined8 *)&in_RDI->_readerOpts = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (in_RDI->_error)._line = 0;
  (in_RDI->_error)._type = None;
  *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
  (in_RDI->_error)._file = (char *)0x0;
  (in_RDI->_error)._msg._M_string_length = 0;
  (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
  (in_RDI->_content).symbology.code = '\0';
  (in_RDI->_content).symbology.modifier = '\0';
  (in_RDI->_content).symbology.eciModifierOffset = '\0';
  (in_RDI->_content).symbology.aiFlag = None;
  (in_RDI->_content).defaultCharset = Unknown;
  (in_RDI->_content).hasECI = false;
  *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
  *(undefined8 *)&(in_RDI->_error)._msg = 0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_RDI->_isMirrored = false;
  in_RDI->_isInverted = false;
  in_RDI->_readerInit = false;
  *(undefined5 *)&in_RDI->field_0xd3 = 0;
  Result::Result((Result *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  local_104 = 1;
LAB_0029ecb7:
  std::__cxx11::string::~string(local_70);
  return in_RDI;
}

Assistant:

Barcode ITFReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	const int minCharCount = 6;
	const int minQuietZone = 10;

	next = FindLeftGuard(next, 4 + minCharCount/2 + 3, START_PATTERN_, minQuietZone);
	if (!next.isValid())
		return {};

	std::string txt;
	txt.reserve(20);

	constexpr int weights[] = {1, 2, 4, 7, 0};
	int xStart = next.pixelsInFront();
	next = next.subView(4, 10);

	while (next.isValid()) {
		const auto threshold = NarrowWideThreshold(next);
		if (!threshold.isValid())
			break;

		BarAndSpace<int> digits, numWide;
		for (int i = 0; i < 10; ++i) {
			if (next[i] > threshold[i] * 2)
				break;
			numWide[i] += next[i] > threshold[i];
			digits[i] += weights[i/2] * (next[i] > threshold[i]);
		}

		if (numWide.bar != 2 || numWide.space != 2)
			break;

		for (int i = 0; i < 2; ++i)
			txt.push_back(ToDigit(digits[i] == 11 ? 0 : digits[i]));

		next.skipSymbol();
	}

	next = next.subView(0, 3);

	if (Size(txt) < minCharCount || !next.isValid())
		return {};

	if (!IsRightGuard(next, STOP_PATTERN_1, minQuietZone) && !IsRightGuard(next, STOP_PATTERN_2, minQuietZone))
		return {};

	Error error = _opts.validateITFCheckSum() && !GTIN::IsCheckDigitValid(txt) ? ChecksumError() : Error();

	// Symbology identifier ISO/IEC 16390:2007 Annex C Table C.1
	// See also GS1 General Specifications 5.1.2 Figure 5.1.2-2
	SymbologyIdentifier symbologyIdentifier = {'I', GTIN::IsCheckDigitValid(txt) ? '1' : '0'};
	
	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::ITF, symbologyIdentifier, error);
}